

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack1to16.h
# Opt level: O1

void ncnn::im2col_sgemm_pack1to16_avx512
               (Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  undefined4 uVar1;
  undefined1 auVar2 [64];
  uint uVar3;
  int iVar4;
  uint _h;
  size_t sVar5;
  size_t sVar6;
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  int *piVar15;
  uint uVar16;
  _func_int ***ppp_Var17;
  undefined4 *puVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  undefined4 *puVar23;
  undefined1 (*pauVar24) [64];
  ulong uVar25;
  undefined1 (*pauVar26) [64];
  undefined1 (*pauVar27) [64];
  uint uVar28;
  ulong uVar29;
  undefined1 (*pauVar30) [16];
  long lVar31;
  int iVar32;
  undefined1 (*pauVar33) [32];
  undefined4 *puVar34;
  int iVar35;
  int iVar36;
  long lVar37;
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  float zeros [16];
  Mat local_d8;
  ulong local_90;
  Allocator *local_88;
  void *local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  
  uVar3 = bottom_im2col->w;
  uVar21 = (ulong)(int)uVar3;
  iVar4 = bottom_im2col->h;
  _h = bottom_im2col->c;
  uVar20 = (ulong)_h;
  local_90 = (ulong)(uint)top_blob->c;
  local_80 = _bias->data;
  local_d8.cstep = 0;
  local_d8.data = (Allocator *)0x0;
  local_d8.refcount._0_4_ = 0;
  local_d8.refcount._4_4_ = 0;
  local_d8.elemsize._0_4_ = 0;
  local_d8.elempack = 0;
  local_d8._48_8_ = SUB168(ZEXT816(0) << 0x40,4);
  if ((long)uVar21 < 8) {
    uVar16 = uVar3;
    iVar35 = iVar4;
    if (3 < (int)uVar3) {
      iVar35 = iVar4 * 4;
      uVar16 = (uVar3 & 3) + 1;
    }
  }
  else {
    uVar16 = (uVar3 & 3) + (uVar3 >> 3) + (uint)((uVar3 >> 2 & 1) != 0);
    iVar35 = iVar4 * 8;
  }
  local_d8.elemsize._4_4_ = (int)local_d8.refcount;
  local_d8.allocator = (Allocator *)local_d8.data;
  local_d8.dims = (int)local_d8.refcount;
  local_d8.w = local_d8.refcount._4_4_;
  local_d8.c = local_d8.elempack;
  Mat::create(&local_d8,iVar35,_h,uVar16,4,1,opt->workspace_allocator);
  uVar16 = (int)uVar3 >> 3;
  if (0 < (int)uVar16) {
    lVar22 = 0;
    uVar25 = 0;
    do {
      if (0 < (int)_h) {
        ppp_Var17 = (_func_int ***)
                    ((long)(_func_int ***)local_d8.data +
                    local_d8.cstep * uVar25 *
                    CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize));
        uVar29 = 0;
        do {
          if (0 < iVar4) {
            pauVar33 = (undefined1 (*) [32])
                       ((long)bottom_im2col->data +
                       bottom_im2col->cstep * bottom_im2col->elemsize * uVar29 + lVar22);
            iVar35 = iVar4;
            do {
              *(undefined1 (*) [32])ppp_Var17 = *pauVar33;
              ppp_Var17 = ppp_Var17 + 4;
              pauVar33 = (undefined1 (*) [32])(*pauVar33 + uVar21 * 4);
              iVar35 = iVar35 + -1;
            } while (iVar35 != 0);
          }
          uVar29 = uVar29 + 1;
        } while (uVar29 != uVar20);
      }
      uVar25 = uVar25 + 1;
      lVar22 = lVar22 + 0x20;
    } while (uVar25 != uVar16);
  }
  uVar19 = uVar3 >> 2 & 1;
  if ((uVar19 != 0) && (0 < (int)_h)) {
    ppp_Var17 = (_func_int ***)
                ((long)(_func_int ***)local_d8.data +
                (long)(int)uVar16 * local_d8.cstep *
                CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize));
    uVar25 = 0;
    do {
      if (0 < iVar4) {
        pauVar30 = (undefined1 (*) [16])
                   ((long)bottom_im2col->data +
                   bottom_im2col->cstep * bottom_im2col->elemsize * uVar25 +
                   (uVar21 & 0xfffffffffffffff8) * 4);
        iVar35 = iVar4;
        do {
          *(undefined1 (*) [16])ppp_Var17 = *pauVar30;
          ppp_Var17 = ppp_Var17 + 2;
          pauVar30 = (undefined1 (*) [16])(*pauVar30 + uVar21 * 4);
          iVar35 = iVar35 + -1;
        } while (iVar35 != 0);
      }
      uVar25 = uVar25 + 1;
    } while (uVar25 != uVar20);
  }
  iVar35 = (int)(uVar21 & 0xfffffffffffffff8) + uVar19 * 4;
  if (iVar35 < (int)uVar3) {
    local_88 = (Allocator *)local_d8.data;
    lVar22 = (long)iVar35;
    puVar18 = (undefined4 *)(lVar22 * 4 + (long)bottom_im2col->data);
    sVar5 = bottom_im2col->cstep;
    sVar6 = bottom_im2col->elemsize;
    do {
      if (0 < (int)_h) {
        uVar16 = (uint)lVar22;
        uVar28 = uVar16 + 7;
        uVar19 = uVar16 + 3;
        if (-1 < (int)uVar16) {
          uVar28 = uVar16;
          uVar19 = uVar16;
        }
        iVar32 = uVar16 - (uVar28 & 0xfffffff8);
        iVar35 = (uVar16 - (uVar28 & 0xfffffff8)) + 3;
        if (-1 < iVar32) {
          iVar35 = iVar32;
        }
        ppp_Var17 = (_func_int ***)
                    ((long)(_func_int ***)local_d8.data +
                    (long)(int)((iVar35 >> 2) +
                               ((int)uVar28 >> 3) + (uVar16 - (uVar19 & 0xfffffffc))) *
                    local_d8.cstep * CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize)
                    );
        uVar25 = 0;
        puVar23 = puVar18;
        do {
          puVar34 = puVar23;
          iVar35 = iVar4;
          if (0 < iVar4) {
            do {
              *(undefined4 *)ppp_Var17 = *puVar34;
              ppp_Var17 = (_func_int ***)((long)ppp_Var17 + 4);
              puVar34 = puVar34 + uVar21;
              iVar35 = iVar35 + -1;
            } while (iVar35 != 0);
          }
          uVar25 = uVar25 + 1;
          puVar23 = (undefined4 *)((long)puVar23 + sVar5 * sVar6);
        } while (uVar25 != uVar20);
      }
      lVar22 = lVar22 + 1;
      puVar18 = puVar18 + 1;
    } while (lVar22 < (long)uVar21);
  }
  if (0 < (int)local_90) {
    iVar35 = _h * iVar4;
    uVar20 = 0;
    do {
      pauVar26 = (undefined1 (*) [64])
                 (top_blob->cstep * uVar20 * top_blob->elemsize + (long)top_blob->data);
      pauVar27 = (undefined1 (*) [64])(uVar20 * 0x40 + (long)local_80);
      if (local_80 == (void *)0x0) {
        pauVar27 = (undefined1 (*) [64])&local_78;
      }
      local_78 = 0;
      uStack_70 = 0;
      uStack_68 = 0;
      uStack_60 = 0;
      uStack_58 = 0;
      uStack_50 = 0;
      uStack_48 = 0;
      uStack_40 = 0;
      if ((int)uVar3 < 8) {
        uVar25 = 0;
      }
      else {
        lVar22 = 0;
        uVar29 = 0;
        do {
          auVar45 = *pauVar27;
          auVar44 = auVar45;
          auVar43 = auVar45;
          auVar42 = auVar45;
          auVar41 = auVar45;
          auVar40 = auVar45;
          auVar39 = auVar45;
          auVar38 = auVar45;
          if (0 < iVar35) {
            lVar31 = local_d8.cstep *
                     CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize) * lVar22;
            lVar37 = 0;
            iVar32 = iVar35;
            do {
              auVar2 = *(undefined1 (*) [64])
                        ((long)kernel->data + lVar37 * 2 + kernel->cstep * uVar20 * kernel->elemsize
                        );
              uVar1 = *(undefined4 *)((long)(_func_int ***)local_d8.data + lVar37 + lVar31);
              auVar7._4_4_ = uVar1;
              auVar7._0_4_ = uVar1;
              auVar7._8_4_ = uVar1;
              auVar7._12_4_ = uVar1;
              auVar7._16_4_ = uVar1;
              auVar7._20_4_ = uVar1;
              auVar7._24_4_ = uVar1;
              auVar7._28_4_ = uVar1;
              auVar7._32_4_ = uVar1;
              auVar7._36_4_ = uVar1;
              auVar7._40_4_ = uVar1;
              auVar7._44_4_ = uVar1;
              auVar7._48_4_ = uVar1;
              auVar7._52_4_ = uVar1;
              auVar7._56_4_ = uVar1;
              auVar7._60_4_ = uVar1;
              auVar38 = vfmadd231ps_avx512f(auVar38,auVar2,auVar7);
              uVar1 = *(undefined4 *)((long)(_func_int ***)local_d8.data + lVar37 + lVar31 + 4);
              auVar8._4_4_ = uVar1;
              auVar8._0_4_ = uVar1;
              auVar8._8_4_ = uVar1;
              auVar8._12_4_ = uVar1;
              auVar8._16_4_ = uVar1;
              auVar8._20_4_ = uVar1;
              auVar8._24_4_ = uVar1;
              auVar8._28_4_ = uVar1;
              auVar8._32_4_ = uVar1;
              auVar8._36_4_ = uVar1;
              auVar8._40_4_ = uVar1;
              auVar8._44_4_ = uVar1;
              auVar8._48_4_ = uVar1;
              auVar8._52_4_ = uVar1;
              auVar8._56_4_ = uVar1;
              auVar8._60_4_ = uVar1;
              auVar39 = vfmadd231ps_avx512f(auVar39,auVar2,auVar8);
              uVar1 = *(undefined4 *)
                       ((long)&((Allocator *)((long)local_d8.data + 8))->_vptr_Allocator +
                       lVar37 + lVar31);
              auVar9._4_4_ = uVar1;
              auVar9._0_4_ = uVar1;
              auVar9._8_4_ = uVar1;
              auVar9._12_4_ = uVar1;
              auVar9._16_4_ = uVar1;
              auVar9._20_4_ = uVar1;
              auVar9._24_4_ = uVar1;
              auVar9._28_4_ = uVar1;
              auVar9._32_4_ = uVar1;
              auVar9._36_4_ = uVar1;
              auVar9._40_4_ = uVar1;
              auVar9._44_4_ = uVar1;
              auVar9._48_4_ = uVar1;
              auVar9._52_4_ = uVar1;
              auVar9._56_4_ = uVar1;
              auVar9._60_4_ = uVar1;
              auVar40 = vfmadd231ps_avx512f(auVar40,auVar2,auVar9);
              uVar1 = *(undefined4 *)
                       ((long)&((Allocator *)((long)local_d8.data + 8))->_vptr_Allocator +
                       lVar37 + lVar31 + 4);
              auVar10._4_4_ = uVar1;
              auVar10._0_4_ = uVar1;
              auVar10._8_4_ = uVar1;
              auVar10._12_4_ = uVar1;
              auVar10._16_4_ = uVar1;
              auVar10._20_4_ = uVar1;
              auVar10._24_4_ = uVar1;
              auVar10._28_4_ = uVar1;
              auVar10._32_4_ = uVar1;
              auVar10._36_4_ = uVar1;
              auVar10._40_4_ = uVar1;
              auVar10._44_4_ = uVar1;
              auVar10._48_4_ = uVar1;
              auVar10._52_4_ = uVar1;
              auVar10._56_4_ = uVar1;
              auVar10._60_4_ = uVar1;
              auVar41 = vfmadd231ps_avx512f(auVar41,auVar2,auVar10);
              uVar1 = *(undefined4 *)
                       ((long)&((Allocator *)((long)local_d8.data + 0x10))->_vptr_Allocator +
                       lVar37 + lVar31);
              auVar11._4_4_ = uVar1;
              auVar11._0_4_ = uVar1;
              auVar11._8_4_ = uVar1;
              auVar11._12_4_ = uVar1;
              auVar11._16_4_ = uVar1;
              auVar11._20_4_ = uVar1;
              auVar11._24_4_ = uVar1;
              auVar11._28_4_ = uVar1;
              auVar11._32_4_ = uVar1;
              auVar11._36_4_ = uVar1;
              auVar11._40_4_ = uVar1;
              auVar11._44_4_ = uVar1;
              auVar11._48_4_ = uVar1;
              auVar11._52_4_ = uVar1;
              auVar11._56_4_ = uVar1;
              auVar11._60_4_ = uVar1;
              auVar42 = vfmadd231ps_avx512f(auVar42,auVar2,auVar11);
              uVar1 = *(undefined4 *)
                       ((long)&((Allocator *)((long)local_d8.data + 0x10))->_vptr_Allocator +
                       lVar37 + lVar31 + 4);
              auVar12._4_4_ = uVar1;
              auVar12._0_4_ = uVar1;
              auVar12._8_4_ = uVar1;
              auVar12._12_4_ = uVar1;
              auVar12._16_4_ = uVar1;
              auVar12._20_4_ = uVar1;
              auVar12._24_4_ = uVar1;
              auVar12._28_4_ = uVar1;
              auVar12._32_4_ = uVar1;
              auVar12._36_4_ = uVar1;
              auVar12._40_4_ = uVar1;
              auVar12._44_4_ = uVar1;
              auVar12._48_4_ = uVar1;
              auVar12._52_4_ = uVar1;
              auVar12._56_4_ = uVar1;
              auVar12._60_4_ = uVar1;
              auVar43 = vfmadd231ps_avx512f(auVar43,auVar2,auVar12);
              uVar1 = *(undefined4 *)
                       ((long)&((Allocator *)((long)local_d8.data + 0x18))->_vptr_Allocator +
                       lVar37 + lVar31);
              auVar13._4_4_ = uVar1;
              auVar13._0_4_ = uVar1;
              auVar13._8_4_ = uVar1;
              auVar13._12_4_ = uVar1;
              auVar13._16_4_ = uVar1;
              auVar13._20_4_ = uVar1;
              auVar13._24_4_ = uVar1;
              auVar13._28_4_ = uVar1;
              auVar13._32_4_ = uVar1;
              auVar13._36_4_ = uVar1;
              auVar13._40_4_ = uVar1;
              auVar13._44_4_ = uVar1;
              auVar13._48_4_ = uVar1;
              auVar13._52_4_ = uVar1;
              auVar13._56_4_ = uVar1;
              auVar13._60_4_ = uVar1;
              auVar44 = vfmadd231ps_avx512f(auVar44,auVar2,auVar13);
              uVar1 = *(undefined4 *)
                       ((long)&((Allocator *)((long)local_d8.data + 0x18))->_vptr_Allocator +
                       lVar37 + lVar31 + 4);
              auVar14._4_4_ = uVar1;
              auVar14._0_4_ = uVar1;
              auVar14._8_4_ = uVar1;
              auVar14._12_4_ = uVar1;
              auVar14._16_4_ = uVar1;
              auVar14._20_4_ = uVar1;
              auVar14._24_4_ = uVar1;
              auVar14._28_4_ = uVar1;
              auVar14._32_4_ = uVar1;
              auVar14._36_4_ = uVar1;
              auVar14._40_4_ = uVar1;
              auVar14._44_4_ = uVar1;
              auVar14._48_4_ = uVar1;
              auVar14._52_4_ = uVar1;
              auVar14._56_4_ = uVar1;
              auVar14._60_4_ = uVar1;
              auVar45 = vfmadd231ps_avx512f(auVar45,auVar2,auVar14);
              lVar37 = lVar37 + 0x20;
              iVar32 = iVar32 + -1;
            } while (iVar32 != 0);
          }
          *pauVar26 = auVar38;
          pauVar26[1] = auVar39;
          pauVar26[2] = auVar40;
          pauVar26[3] = auVar41;
          pauVar26[4] = auVar42;
          pauVar26[5] = auVar43;
          pauVar26[6] = auVar44;
          pauVar26[7] = auVar45;
          pauVar26 = pauVar26 + 8;
          uVar25 = uVar29 + 8;
          lVar31 = uVar29 + 0xf;
          lVar22 = lVar22 + 1;
          uVar29 = uVar25;
        } while (lVar31 < (long)uVar21);
      }
      if ((int)((uint)uVar25 | 3) < (int)uVar3) {
        uVar16 = 0;
        do {
          auVar45 = *pauVar27;
          iVar32 = (int)uVar25;
          auVar44 = auVar45;
          auVar43 = auVar45;
          auVar42 = auVar45;
          if (0 < (int)(_h * iVar4)) {
            lVar22 = local_d8.cstep *
                     CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize) *
                     (ulong)((uVar16 & 1) + ((uint)(uVar25 >> 3) & 0x1fffffff));
            lVar31 = 0;
            iVar36 = iVar35;
            do {
              auVar41 = *(undefined1 (*) [64])
                         ((long)kernel->data +
                         lVar31 * 4 + kernel->cstep * uVar20 * kernel->elemsize);
              uVar1 = *(undefined4 *)((long)(_func_int ***)local_d8.data + lVar31 + lVar22);
              auVar40._4_4_ = uVar1;
              auVar40._0_4_ = uVar1;
              auVar40._8_4_ = uVar1;
              auVar40._12_4_ = uVar1;
              auVar40._16_4_ = uVar1;
              auVar40._20_4_ = uVar1;
              auVar40._24_4_ = uVar1;
              auVar40._28_4_ = uVar1;
              auVar40._32_4_ = uVar1;
              auVar40._36_4_ = uVar1;
              auVar40._40_4_ = uVar1;
              auVar40._44_4_ = uVar1;
              auVar40._48_4_ = uVar1;
              auVar40._52_4_ = uVar1;
              auVar40._56_4_ = uVar1;
              auVar40._60_4_ = uVar1;
              auVar42 = vfmadd231ps_avx512f(auVar42,auVar41,auVar40);
              uVar1 = *(undefined4 *)((long)(_func_int ***)local_d8.data + lVar31 + lVar22 + 4);
              auVar39._4_4_ = uVar1;
              auVar39._0_4_ = uVar1;
              auVar39._8_4_ = uVar1;
              auVar39._12_4_ = uVar1;
              auVar39._16_4_ = uVar1;
              auVar39._20_4_ = uVar1;
              auVar39._24_4_ = uVar1;
              auVar39._28_4_ = uVar1;
              auVar39._32_4_ = uVar1;
              auVar39._36_4_ = uVar1;
              auVar39._40_4_ = uVar1;
              auVar39._44_4_ = uVar1;
              auVar39._48_4_ = uVar1;
              auVar39._52_4_ = uVar1;
              auVar39._56_4_ = uVar1;
              auVar39._60_4_ = uVar1;
              auVar43 = vfmadd231ps_avx512f(auVar43,auVar41,auVar39);
              uVar1 = *(undefined4 *)
                       ((long)&((Allocator *)((long)local_d8.data + 8))->_vptr_Allocator +
                       lVar31 + lVar22);
              auVar38._4_4_ = uVar1;
              auVar38._0_4_ = uVar1;
              auVar38._8_4_ = uVar1;
              auVar38._12_4_ = uVar1;
              auVar38._16_4_ = uVar1;
              auVar38._20_4_ = uVar1;
              auVar38._24_4_ = uVar1;
              auVar38._28_4_ = uVar1;
              auVar38._32_4_ = uVar1;
              auVar38._36_4_ = uVar1;
              auVar38._40_4_ = uVar1;
              auVar38._44_4_ = uVar1;
              auVar38._48_4_ = uVar1;
              auVar38._52_4_ = uVar1;
              auVar38._56_4_ = uVar1;
              auVar38._60_4_ = uVar1;
              auVar44 = vfmadd231ps_avx512f(auVar44,auVar41,auVar38);
              uVar1 = *(undefined4 *)
                       ((long)&((Allocator *)((long)local_d8.data + 8))->_vptr_Allocator +
                       lVar31 + lVar22 + 4);
              auVar2._4_4_ = uVar1;
              auVar2._0_4_ = uVar1;
              auVar2._8_4_ = uVar1;
              auVar2._12_4_ = uVar1;
              auVar2._16_4_ = uVar1;
              auVar2._20_4_ = uVar1;
              auVar2._24_4_ = uVar1;
              auVar2._28_4_ = uVar1;
              auVar2._32_4_ = uVar1;
              auVar2._36_4_ = uVar1;
              auVar2._40_4_ = uVar1;
              auVar2._44_4_ = uVar1;
              auVar2._48_4_ = uVar1;
              auVar2._52_4_ = uVar1;
              auVar2._56_4_ = uVar1;
              auVar2._60_4_ = uVar1;
              auVar45 = vfmadd231ps_avx512f(auVar45,auVar41,auVar2);
              lVar31 = lVar31 + 0x10;
              iVar36 = iVar36 + -1;
            } while (iVar36 != 0);
          }
          *pauVar26 = auVar42;
          pauVar26[1] = auVar43;
          pauVar26[2] = auVar44;
          pauVar26[3] = auVar45;
          pauVar26 = pauVar26 + 4;
          uVar25 = (ulong)(iVar32 + 4);
          uVar16 = (uint)(byte)((char)uVar16 + 1);
        } while (iVar32 + 7 < (int)uVar3);
      }
      else {
        uVar25 = uVar25 & 0xffffffff;
      }
      if ((int)uVar25 < (int)uVar3) {
        do {
          uVar16 = (uint)uVar25;
          auVar45 = *pauVar27;
          if (0 < (int)(_h * iVar4)) {
            pauVar24 = (undefined1 (*) [64])
                       (kernel->cstep * uVar20 * kernel->elemsize + (long)kernel->data);
            lVar22 = 0;
            do {
              uVar1 = *(undefined4 *)
                       ((long)(_func_int ***)local_d8.data +
                       lVar22 * 4 +
                       local_d8.cstep *
                       CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize) *
                       (ulong)((uVar16 & 3) + (int)(uVar25 >> 3) + (uint)((uVar16 >> 2 & 1) != 0)));
              auVar44._4_4_ = uVar1;
              auVar44._0_4_ = uVar1;
              auVar44._8_4_ = uVar1;
              auVar44._12_4_ = uVar1;
              auVar44._16_4_ = uVar1;
              auVar44._20_4_ = uVar1;
              auVar44._24_4_ = uVar1;
              auVar44._28_4_ = uVar1;
              auVar44._32_4_ = uVar1;
              auVar44._36_4_ = uVar1;
              auVar44._40_4_ = uVar1;
              auVar44._44_4_ = uVar1;
              auVar44._48_4_ = uVar1;
              auVar44._52_4_ = uVar1;
              auVar44._56_4_ = uVar1;
              auVar44._60_4_ = uVar1;
              auVar45 = vfmadd231ps_avx512f(auVar45,*pauVar24,auVar44);
              pauVar24 = pauVar24 + 1;
              lVar22 = lVar22 + 1;
            } while (iVar35 != (int)lVar22);
          }
          *pauVar26 = auVar45;
          pauVar26 = pauVar26 + 1;
          uVar25 = (ulong)(uVar16 + 1);
        } while (uVar16 + 1 != uVar3);
      }
      uVar20 = uVar20 + 1;
    } while (uVar20 != local_90);
  }
  piVar15 = (int *)CONCAT44(local_d8.refcount._4_4_,(int)local_d8.refcount);
  if (piVar15 != (int *)0x0) {
    LOCK();
    *piVar15 = *piVar15 + -1;
    UNLOCK();
    if (*piVar15 == 0) {
      if (local_d8.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_d8.data != (Allocator *)0x0) {
          free(local_d8.data);
        }
      }
      else {
        (*(local_d8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void im2col_sgemm_pack1to16_avx512(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    // Mat bottom_im2col(size, maxk, inch, 4u, 1, opt.workspace_allocator);

    const int size = bottom_im2col.w;
    const int maxk = bottom_im2col.h;
    const int inch = bottom_im2col.c;

    const int outch = top_blob.c;

    const float* bias = _bias;

    // permute
    Mat tmp;
    if (size >= 8)
        tmp.create(8 * maxk, inch, size / 8 + (size % 8) / 4 + size % 4, 4u, 1, opt.workspace_allocator);
    else if (size >= 4)
        tmp.create(4 * maxk, inch, size / 4 + size % 4, 4u, 1, opt.workspace_allocator);
    else
        tmp.create(maxk, inch, size, 4u, 1, opt.workspace_allocator);
    {
        int nn_size = size >> 3;
        int remain_size_start = 0;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 8;

            float* tmpptr = tmp.channel(i / 8);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    __m256 _r0 = _mm256_loadu_ps(img0);
                    _mm256_store_ps(tmpptr, _r0);

                    img0 += size;
                    tmpptr += 8;
                }
            }
        }

        remain_size_start += nn_size << 3;
        nn_size = (size - remain_size_start) >> 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 4;

            float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    __m128 _r0 = _mm_loadu_ps(img0);
                    _mm_store_ps(tmpptr, _r0);

                    img0 += size;
                    tmpptr += 4;
                }
            }
        }

        remain_size_start += nn_size << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < size; i++)
        {
            float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4 + i % 4);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    img0 += size;
                    tmpptr += 1;
                }
            }
        }
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        float* outptr0 = top_blob.channel(p);

        const float zeros[16] = {0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f};
        const float* biasptr = bias ? bias + p * 16 : zeros;

        int i = 0;
        for (; i + 7 < size; i += 8)
        {
            const float* tmpptr = tmp.channel(i / 8);
            const float* kptr0 = kernel.channel(p);

            int nn = inch * maxk; // inch always > 0

            __m512 _sum0 = _mm512_loadu_ps(biasptr);
            __m512 _sum1 = _sum0;
            __m512 _sum2 = _sum0;
            __m512 _sum3 = _sum0;
            __m512 _sum4 = _sum0;
            __m512 _sum5 = _sum0;
            __m512 _sum6 = _sum0;
            __m512 _sum7 = _sum0;

            for (int j = 0; j < nn; j++)
            {
                __m512 _w0 = _mm512_load_ps(kptr0);

                __m512 _val0 = _mm512_set1_ps(tmpptr[0]);
                __m512 _val1 = _mm512_set1_ps(tmpptr[1]);
                __m512 _val2 = _mm512_set1_ps(tmpptr[2]);
                __m512 _val3 = _mm512_set1_ps(tmpptr[3]);
                __m512 _val4 = _mm512_set1_ps(tmpptr[4]);
                __m512 _val5 = _mm512_set1_ps(tmpptr[5]);
                __m512 _val6 = _mm512_set1_ps(tmpptr[6]);
                __m512 _val7 = _mm512_set1_ps(tmpptr[7]);

                _sum0 = _mm512_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm512_fmadd_ps(_val1, _w0, _sum1);
                _sum2 = _mm512_fmadd_ps(_val2, _w0, _sum2);
                _sum3 = _mm512_fmadd_ps(_val3, _w0, _sum3);
                _sum4 = _mm512_fmadd_ps(_val4, _w0, _sum4);
                _sum5 = _mm512_fmadd_ps(_val5, _w0, _sum5);
                _sum6 = _mm512_fmadd_ps(_val6, _w0, _sum6);
                _sum7 = _mm512_fmadd_ps(_val7, _w0, _sum7);

                tmpptr += 8;
                kptr0 += 16;
            }

            _mm512_store_ps(outptr0, _sum0);
            _mm512_store_ps(outptr0 + 16, _sum1);
            _mm512_store_ps(outptr0 + 16 * 2, _sum2);
            _mm512_store_ps(outptr0 + 16 * 3, _sum3);
            _mm512_store_ps(outptr0 + 16 * 4, _sum4);
            _mm512_store_ps(outptr0 + 16 * 5, _sum5);
            _mm512_store_ps(outptr0 + 16 * 6, _sum6);
            _mm512_store_ps(outptr0 + 16 * 7, _sum7);
            outptr0 += 128;
        }
        for (; i + 3 < size; i += 4)
        {
            const float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4);
            const float* kptr0 = kernel.channel(p);

            int nn = inch * maxk; // inch always > 0

            __m512 _sum0 = _mm512_loadu_ps(biasptr);
            __m512 _sum1 = _sum0;
            __m512 _sum2 = _sum0;
            __m512 _sum3 = _sum0;

            for (int j = 0; j < nn; j++)
            {
                __m512 _w0 = _mm512_load_ps(kptr0);

                __m512 _val0 = _mm512_set1_ps(tmpptr[0]);
                __m512 _val1 = _mm512_set1_ps(tmpptr[1]);
                __m512 _val2 = _mm512_set1_ps(tmpptr[2]);
                __m512 _val3 = _mm512_set1_ps(tmpptr[3]);

                _sum0 = _mm512_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm512_fmadd_ps(_val1, _w0, _sum1);
                _sum2 = _mm512_fmadd_ps(_val2, _w0, _sum2);
                _sum3 = _mm512_fmadd_ps(_val3, _w0, _sum3);

                tmpptr += 4;
                kptr0 += 16;
            }

            _mm512_store_ps(outptr0, _sum0);
            _mm512_store_ps(outptr0 + 16, _sum1);
            _mm512_store_ps(outptr0 + 32, _sum2);
            _mm512_store_ps(outptr0 + 48, _sum3);
            outptr0 += 64;
        }
        for (; i < size; i++)
        {
            const float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4 + i % 4);
            const float* kptr0 = kernel.channel(p);

            int nn = inch * maxk; // inch always > 0

            __m512 _sum = _mm512_loadu_ps(biasptr);

            for (int j = 0; j < nn; j++)
            {
                __m512 _w0 = _mm512_load_ps(kptr0);
                __m512 _val = _mm512_set1_ps(tmpptr[0]);
                _sum = _mm512_fmadd_ps(_w0, _val, _sum);

                tmpptr += 1;
                kptr0 += 16;
            }

            _mm512_store_ps(outptr0, _sum);
            outptr0 += 16;
        }
    }
}